

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

int64_t duckdb::DatePart::TimezoneHourOperator::Operation<duckdb::interval_t,long>(interval_t input)

{
  NotImplementedException *this;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10,input.micros);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"\"interval\" units \"timezone_hour\" not recognized","");
  duckdb::NotImplementedException::NotImplementedException(this,(string *)local_40);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int64_t DatePart::TimezoneHourOperator::Operation(interval_t input) {
	throw NotImplementedException("\"interval\" units \"timezone_hour\" not recognized");
}